

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O1

xmlChar * xmlACatalogResolveSystem(xmlCatalogPtr catal,xmlChar *sysID)

{
  xmlGenericErrorFunc p_Var1;
  xmlGenericErrorFunc *pp_Var2;
  void **ppvVar3;
  xmlChar *pxVar4;
  void *pvVar5;
  
  if (catal != (xmlCatalogPtr)0x0 && sysID != (xmlChar *)0x0) {
    if (xmlDebugCatalogs != 0) {
      pp_Var2 = __xmlGenericError();
      p_Var1 = *pp_Var2;
      ppvVar3 = __xmlGenericErrorContext();
      (*p_Var1)(*ppvVar3,"Resolve sysID %s\n",sysID);
    }
    if (catal->type == XML_XML_CATALOG_TYPE) {
      pxVar4 = xmlCatalogListXMLResolve(catal->xml,(xmlChar *)0x0,sysID);
      if (pxVar4 != (xmlChar *)0xffffffffffffffff) {
        return pxVar4;
      }
      return (xmlChar *)0x0;
    }
    if (((catal->sgml == (xmlHashTablePtr)0x0) ||
        (pvVar5 = xmlHashLookup(catal->sgml,sysID), pvVar5 == (void *)0x0)) ||
       (*(int *)((long)pvVar5 + 0x18) != 0xd)) {
      pxVar4 = (xmlChar *)0x0;
    }
    else {
      pxVar4 = *(xmlChar **)((long)pvVar5 + 0x30);
    }
    if (pxVar4 != (xmlChar *)0x0) {
      pxVar4 = xmlStrdup(pxVar4);
      return pxVar4;
    }
  }
  return (xmlChar *)0x0;
}

Assistant:

xmlChar *
xmlACatalogResolveSystem(xmlCatalogPtr catal, const xmlChar *sysID) {
    xmlChar *ret = NULL;

    if ((sysID == NULL) || (catal == NULL))
	return(NULL);

    if (xmlDebugCatalogs)
	xmlGenericError(xmlGenericErrorContext,
		"Resolve sysID %s\n", sysID);

    if (catal->type == XML_XML_CATALOG_TYPE) {
	ret = xmlCatalogListXMLResolve(catal->xml, NULL, sysID);
	if (ret == XML_CATAL_BREAK)
	    ret = NULL;
    } else {
	const xmlChar *sgml;

	sgml = xmlCatalogGetSGMLSystem(catal->sgml, sysID);
	if (sgml != NULL)
	    ret = xmlStrdup(sgml);
    }
    return(ret);
}